

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeModeData
                  (Error *__return_storage_ptr__,ModeData *aModeData,ByteArray *aBuf)

{
  byte *pbVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_13a;
  v10 local_139;
  v10 *local_138;
  char *local_130;
  string local_128;
  Error local_108;
  undefined1 local_e0 [8];
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d0;
  ByteArray *aBuf_local;
  ModeData *aModeData_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  Error **local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  Error **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  length._7_1_ = 0;
  local_d0 = aBuf;
  aBuf_local = (ByteArray *)aModeData;
  aModeData_local = (ModeData *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_e0 = (undefined1  [8])
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d0);
  if (local_e0 == (undefined1  [8])0x1) {
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d0,0);
    *(bool *)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start = (*pbVar1 & 1) != 0;
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d0,0);
    *(bool *)((long)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_start + 1) = (*pbVar1 & 2) == 0;
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d0,0);
    *(bool *)((long)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_start + 2) = (*pbVar1 & 4) != 0;
  }
  else {
    DecodeModeData::anon_class_1_0_00000001::operator()(&local_13a);
    local_58 = &local_138;
    local_60 = &local_139;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_130 = (char *)bVar2.size_;
    local_138 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<unsigned_long_&,_FMT_COMPILE_STRING,_0>();
    local_68 = &local_128;
    local_78 = local_138;
    pcStack_70 = local_130;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
                *)local_e0;
    local_20 = &local_78;
    local_90 = local_138;
    local_88 = local_130;
    local_18 = local_90;
    pcStack_10 = local_88;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long>
                               (local_80,(v10 *)aModeData,(unsigned_long *)local_68);
    local_48 = local_a0;
    local_50 = &error;
    local_38 = 4;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    fmt.size_ = 4;
    fmt.data_ = local_88;
    local_40 = local_50;
    local_30 = local_48;
    local_28 = local_50;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,local_90,fmt,args);
    Error::Error(&local_108,kBadFormat,&local_128);
    Error::operator=(__return_storage_ptr__,&local_108);
    Error::~Error(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeModeData(ModeData &aModeData, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == 1, error = ERROR_BAD_FORMAT("invalid Mode value length {}, expect 1", length));
    aModeData.mIsRxOnWhenIdleMode          = (aBuf[0] & 0x01) != 0;
    aModeData.mIsMtd                       = (aBuf[0] & 0x02) == 0;
    aModeData.mIsStableNetworkDataRequired = (aBuf[0] & 0x04) != 0;

exit:
    return error;
}